

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_get_combined_image_samplers
          (spvc_compiler compiler,spvc_combined_image_sampler **samplers,size_t *num_samplers)

{
  spvc_variable_id sVar1;
  undefined8 uVar2;
  spvc_context psVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var7;
  long lVar8;
  SmallVector<spvc_combined_image_sampler,_8UL> translated;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> combined;
  undefined1 local_120 [120];
  undefined1 local_a8 [120];
  
  local_a8._0_8_ = local_a8 + 0x18;
  local_a8._8_8_ = 0;
  local_a8._16_8_ = 8;
  spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::operator=
            ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)local_a8,
             &((compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl)->
              combined_image_samplers);
  local_120._0_8_ = local_120 + 0x18;
  local_120._8_8_ = 0;
  local_120._16_8_ = 8;
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::reserve
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)local_120,local_a8._8_8_);
  uVar6 = local_a8._0_8_;
  if (local_a8._8_8_ != 0) {
    lVar5 = local_a8._8_8_ * 0xc;
    lVar8 = 0;
    do {
      sVar1 = *(spvc_variable_id *)((long)&((VariableID *)(uVar6 + 8))->id + lVar8);
      uVar2 = *(undefined8 *)((long)&((VariableID *)uVar6)->id + lVar8);
      spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::reserve
                ((SmallVector<spvc_combined_image_sampler,_8UL> *)local_120,local_120._8_8_ + 1);
      ((spvc_combined_image_sampler *)(local_120._0_8_ + local_120._8_8_ * 0xc))->combined_id =
           (int)uVar2;
      ((spvc_combined_image_sampler *)(local_120._0_8_ + local_120._8_8_ * 0xc))->image_id =
           (int)((ulong)uVar2 >> 0x20);
      ((spvc_combined_image_sampler *)(local_120._0_8_ + local_120._8_8_ * 0xc))->sampler_id = sVar1
      ;
      local_120._8_8_ = local_120._8_8_ + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar5 != lVar8);
  }
  _Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0x80);
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x68) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined ***)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_004fab40;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::operator=
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)
             ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8),
             (SmallVector<spvc_combined_image_sampler,_8UL> *)local_120);
  *samplers = *(spvc_combined_image_sampler **)
               ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8
               );
  *num_samplers =
       *(size_t *)
        ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10);
  psVar3 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar3->allocations,
            (psVar3->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar4 = (psVar3->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar4]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar4 + 1;
  local_120._8_8_ = 0;
  if ((spvc_combined_image_sampler *)local_120._0_8_ !=
      (spvc_combined_image_sampler *)(local_120 + 0x18)) {
    free((void *)local_120._0_8_);
  }
  local_a8._8_8_ = 0;
  if ((CombinedImageSampler *)local_a8._0_8_ != (CombinedImageSampler *)(local_a8 + 0x18)) {
    free((void *)local_a8._0_8_);
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_combined_image_samplers(spvc_compiler compiler,
                                                      const spvc_combined_image_sampler **samplers,
                                                      size_t *num_samplers)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto combined = compiler->compiler->get_combined_image_samplers();
		SmallVector<spvc_combined_image_sampler> translated;
		translated.reserve(combined.size());
		for (auto &c : combined)
		{
			spvc_combined_image_sampler trans = { c.combined_id, c.image_id, c.sampler_id };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_combined_image_sampler>>();
		ptr->buffer = std::move(translated);
		*samplers = ptr->buffer.data();
		*num_samplers = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}